

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O3

bool TestEthernetV2(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile)

{
  char cVar1;
  ushort uVar2;
  uint16_t uVar3;
  bool bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  ostream *poVar7;
  bool bVar8;
  uint16_t MacAddrIn;
  uint16_t MacAddrOutLow;
  uint32_t status;
  uint16_t local_3a;
  uint16_t local_38;
  uint16_t local_36;
  uint32_t local_34;
  
  cVar1 = (char)logFile;
  std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"=== Ethernet (KSZ8851) Test ===",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  uVar6 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  if (uVar6 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   No Ethernet controller, firmware version = ",0x2e);
    BoardIO::GetFirmwareVersion((BoardIO *)Board);
  }
  else {
    FpgaIO::ReadEthernetStatus(&Board->super_FpgaIO,&local_34);
    if ((int)local_34 < 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   Ethernet controller status = ",0x20);
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      FpgaIO::WriteEthernetPhyReset(&Board->super_FpgaIO,0);
      Amp1394_Sleep(0.1);
      FpgaIO::ReadEthernetStatus(&Board->super_FpgaIO,&local_34);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)logFile,"   After reset, status = ",0x19);
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      uVar5 = FpgaIO::ReadKSZ8851ChipID(&Board->super_FpgaIO);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"   Chip ID = ",0xd);
      *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
           *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((uVar5 & 0xfff0) != 0x8870) {
        return false;
      }
      local_36 = 1;
      local_38 = 0x8000;
      bVar8 = true;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)logFile,"   MAC address: ",0x10);
        *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
             *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
        bVar4 = FpgaIO::WriteKSZ8851Reg(&Board->super_FpgaIO,'\x10',&local_36);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,"write low = ",0xc);
          std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        }
        bVar4 = FpgaIO::WriteKSZ8851Reg(&Board->super_FpgaIO,'\x12',&local_38);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)logFile,", write mid = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        }
        local_3a = 0;
        bVar4 = FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x10',&local_3a);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,", read low = ",0xd)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        }
        uVar3 = local_36;
        uVar5 = local_3a;
        bVar4 = FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x12',&local_3a);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile,", read mid = ",0xd)
          ;
          std::ostream::_M_insert<unsigned_long>((ulong)logFile);
        }
        if ((local_38 != local_3a) || (uVar3 != uVar5)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)logFile," ***",4);
          bVar8 = false;
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)logFile + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        local_36 = local_36 * 2;
        uVar2 = local_38 >> 1;
      } while ((local_36 != 0) && (bVar4 = 1 < local_38, local_38 = uVar2, bVar4));
      local_38 = uVar2;
      FpgaIO::WriteEthernetPhyReset(&Board->super_FpgaIO,0);
      return bVar8;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)logFile,"   No Ethernet controller, status = ",0x24);
    *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) =
         *(uint *)(logFile + *(long *)(*(long *)logFile + -0x18) + 0x18) & 0xffffffb5 | 8;
  }
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)logFile);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return false;
}

Assistant:

bool TestEthernetV2(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile)
{
    logFile << std::endl << "=== Ethernet (KSZ8851) Test ===" << std::endl;
    if (Board.GetFirmwareVersion() < 5) {
        logFile << "   No Ethernet controller, firmware version = " << Board.GetFirmwareVersion() << std::endl;
        return false;
    }
    uint32_t status;
    Board.ReadEthernetStatus(status);
    if (!(status & FpgaIO::ETH_STAT_PRESENT_V2)) {
        logFile << "   No Ethernet controller, status = " << std::hex << (status>>16) << std::endl;
        return false;
    }
    logFile << "   Ethernet controller status = " << std::hex << (status>>16) << std::endl;
    // Reset the board
    Board.WriteEthernetPhyReset();
    // Wait 100 msec
    Amp1394_Sleep(0.1);
    // Read the status
    Board.ReadEthernetStatus(status);
    logFile << "   After reset, status = " << std::hex << (status>>16) << std::endl;
    // Read the Chip ID (16-bit read)
    uint16_t chipID = Board.ReadKSZ8851ChipID();
    logFile << "   Chip ID = " << std::hex << chipID << std::endl;
    if ((chipID&0xfff0) != 0x8870)
        return false;
#if 0
    // Read Chip ID using 8-bit read
    // TODO: Reading from 0xC0 works (get 0x72), but not from 0xC1 (get 0xC1 instead of 0x88)
    uint8_t chipIDHigh;
    Board.ReadKSZ8851Reg(0xC1, chipIDHigh);
    logFile << "   Chip ID high (8-bit read) = " << std::hex << static_cast<int>(chipIDHigh) << std::endl;
    if (chipIDHigh != 0x88)
        return false;
#endif
    // Walking bit pattern on MAC address registers (R/W)
    // 0x10 is MARL (MAC Address Register Low)
    // 0x12 is MARM (MAC Address Register Middle)
    uint16_t MacAddrOutLow, MacAddrOutMid, MacAddrIn;
    bool ret = true;
    for (MacAddrOutLow = 0x0001, MacAddrOutMid = 0x8000;
         (MacAddrOutLow != 0) && (MacAddrOutMid != 0);
         MacAddrOutLow <<= 1, MacAddrOutMid >>= 1) {
        logFile << "   MAC address: " << std::hex;
        if (Board.WriteKSZ8851Reg(0x10, MacAddrOutLow))
            logFile << "write low = " << MacAddrOutLow;
        if (Board.WriteKSZ8851Reg(0x12, MacAddrOutMid))
            logFile << ", write mid = " << MacAddrOutMid;
        MacAddrIn = 0;
        bool failed = false;
        if (Board.ReadKSZ8851Reg(0x10, MacAddrIn))
            logFile << ", read low = " << MacAddrIn;
        if (MacAddrOutLow != MacAddrIn) failed = true;
        if (Board.ReadKSZ8851Reg(0x12, MacAddrIn))
            logFile << ", read mid = " << MacAddrIn;
        if (MacAddrOutMid != MacAddrIn) failed = true;
        if (failed) {
            logFile << " ***";
            ret = false;
        }
        logFile << std::endl;
    }
    // Reset the board again (to restore MAC address)
    Board.WriteEthernetPhyReset();
    return ret;
}